

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O1

string * __thiscall
cmCryptoHash::HashString_abi_cxx11_
          (string *__return_storage_ptr__,cmCryptoHash *this,string_view input)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  ByteHashString(&local_28,this,input);
  ByteHashToString_abi_cxx11_(__return_storage_ptr__,(cmCryptoHash *)&local_28,hash);
  if (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCryptoHash::HashString(cm::string_view input)
{
  return ByteHashToString(this->ByteHashString(input));
}